

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O0

word Ifd_ObjTruth_rec(Ifd_Man_t *p,int iLit,int *pCounter)

{
  int iVar1;
  Ifd_Obj_t *pIVar2;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_48;
  word Fun2;
  word Fun1;
  word Fun0;
  Ifd_Obj_t *pDsd;
  int *pCounter_local;
  int iLit_local;
  Ifd_Man_t *p_local;
  
  local_48 = 0;
  iVar1 = Abc_LitIsCompl(iLit);
  if (iVar1 != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                  ,0xe9,"word Ifd_ObjTruth_rec(Ifd_Man_t *, int, int *)");
  }
  if (iLit == 2) {
    iVar1 = *pCounter;
    *pCounter = iVar1 + 1;
    p_local = (Ifd_Man_t *)Ifd_ObjTruth_rec::s_Truths6[iVar1];
  }
  else {
    pIVar2 = Ifd_ManObjFromLit(p,iLit);
    iVar1 = Abc_LitRegular(pIVar2->pFans[0]);
    local_68 = Ifd_ObjTruth_rec(p,iVar1,pCounter);
    iVar1 = Abc_LitRegular(pIVar2->pFans[1]);
    local_70 = Ifd_ObjTruth_rec(p,iVar1,pCounter);
    if (pIVar2->pFans[2] != 0xffffffff) {
      iVar1 = Abc_LitRegular(pIVar2->pFans[2]);
      local_48 = Ifd_ObjTruth_rec(p,iVar1,pCounter);
    }
    iVar1 = Abc_LitIsCompl(pIVar2->pFans[0]);
    if (iVar1 != 0) {
      local_68 = local_68 ^ 0xffffffffffffffff;
    }
    iVar1 = Abc_LitIsCompl(pIVar2->pFans[1]);
    if (iVar1 != 0) {
      local_70 = local_70 ^ 0xffffffffffffffff;
    }
    if (pIVar2->pFans[2] != 0xffffffff) {
      iVar1 = Abc_LitIsCompl(pIVar2->pFans[2]);
      if (iVar1 == 0) {
        local_78 = local_48;
      }
      else {
        local_78 = local_48 ^ 0xffffffffffffffff;
      }
      local_48 = local_78;
    }
    if ((*(uint *)pIVar2 >> 0x1d & 3) == 1) {
      p_local = (Ifd_Man_t *)(local_68 & local_70);
    }
    else if ((*(uint *)pIVar2 >> 0x1d & 3) == 2) {
      p_local = (Ifd_Man_t *)(local_68 ^ local_70);
    }
    else {
      if ((*(uint *)pIVar2 >> 0x1d & 3) != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                      ,0xfe,"word Ifd_ObjTruth_rec(Ifd_Man_t *, int, int *)");
      }
      p_local = (Ifd_Man_t *)(local_48 & local_70 | (local_48 ^ 0xffffffffffffffff) & local_68);
    }
  }
  return (word)p_local;
}

Assistant:

word Ifd_ObjTruth_rec( Ifd_Man_t * p, int iLit, int * pCounter )
{
    static word s_Truths6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    Ifd_Obj_t * pDsd;
    word Fun0, Fun1, Fun2 = 0;
    assert( !Abc_LitIsCompl(iLit) );
    if ( iLit == 2 )
        return s_Truths6[(*pCounter)++];
    pDsd = Ifd_ManObjFromLit( p, iLit );

    Fun0 = Ifd_ObjTruth_rec( p, Abc_LitRegular(pDsd->pFans[0]), pCounter );
    Fun1 = Ifd_ObjTruth_rec( p, Abc_LitRegular(pDsd->pFans[1]), pCounter );
    if ( pDsd->pFans[2] != -1 )
    Fun2 = Ifd_ObjTruth_rec( p, Abc_LitRegular(pDsd->pFans[2]), pCounter );

    Fun0 = Abc_LitIsCompl(pDsd->pFans[0]) ? ~Fun0 : Fun0;
    Fun1 = Abc_LitIsCompl(pDsd->pFans[1]) ? ~Fun1 : Fun1;
    if ( pDsd->pFans[2] != -1 )
    Fun2 = Abc_LitIsCompl(pDsd->pFans[2]) ? ~Fun2 : Fun2;

    if ( pDsd->Type == 1 )
        return Fun0 & Fun1;
    if ( pDsd->Type == 2 )
        return Fun0 ^ Fun1;
    if ( pDsd->Type == 3 )
        return (Fun2 & Fun1) | (~Fun2 & Fun0);
    assert( 0 );
    return -1;
}